

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

SubroutineSymbol *
slang::ast::SubroutineSymbol::fromSyntax
          (Compilation *compilation,ClassMethodDeclarationSyntax *syntax,Scope *parent)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SubroutineSymbol *this;
  pair<slang::bitmask<slang::ast::MethodFlags>,_slang::ast::Visibility> pVar1;
  ushort uVar2;
  pair<slang::ast::SubroutineSymbol_*,_bool> pVar3;
  
  pVar3 = fromSyntax(compilation,(syntax->declaration).ptr,parent,false);
  this = pVar3.first;
  if (this != (SubroutineSymbol *)0x0) {
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&this->super_Symbol,parent,syntax_00);
    pVar1 = getMethodFlags(&syntax->qualifiers,(((syntax->declaration).ptr)->prototype).ptr);
    this->visibility = pVar1.second;
    uVar2 = (this->flags).m_bits | pVar1.first.m_bits.m_bits;
    (this->flags).m_bits = uVar2;
    if ((uVar2 & 4) == 0) {
      addThisVar(this,(Type *)parent->thisSym);
    }
  }
  return this;
}

Assistant:

SubroutineSymbol* SubroutineSymbol::fromSyntax(Compilation& compilation,
                                               const ClassMethodDeclarationSyntax& syntax,
                                               const Scope& parent) {
    auto [result, _] = fromSyntax(compilation, *syntax.declaration, parent, /* outOfBlock */ false);
    if (!result)
        return nullptr;

    result->setAttributes(parent, syntax.attributes);

    auto [flags, visibility] = getMethodFlags(syntax.qualifiers, *syntax.declaration->prototype);
    result->visibility = visibility;
    result->flags |= flags;

    if (!result->flags.has(MethodFlags::Static))
        result->addThisVar(parent.asSymbol().as<ClassType>());

    return result;
}